

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall LinearScan::EndDeadLifetimes(LinearScan *this,Instr *instr,bool isLoopBackEdge)

{
  RealCount *pRVar1;
  RegNum RVar2;
  uint uVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *buffer;
  Type pLVar5;
  SList<StackSlot_*,_Memory::ArenaAllocator,_RealCount> *pSVar6;
  code *pcVar7;
  SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *buffer_00;
  bool bVar8;
  BOOLEAN BVar9;
  uint32 uVar10;
  undefined4 *puVar11;
  Type *ppLVar12;
  Type pSVar13;
  ulong uVar14;
  ulong uVar15;
  NodeBase **this_00;
  undefined1 local_80 [8];
  EditingIterator iter;
  EditingIterator stackPackIter;
  
  bVar8 = SkipNumberedInstr(this,instr);
  if (!bVar8) {
    local_80 = (undefined1  [8])this->activeLiveranges;
    iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
    iter.super_EditingIterator.super_Iterator.list =
         (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_80;
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      bVar8 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                        ((EditingIterator *)local_80);
      if (!bVar8) break;
      ppLVar12 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)local_80);
      uVar3 = (*ppLVar12)->end;
      uVar10 = IR::Instr::GetNumber(instr);
      if (uVar10 < uVar3) break;
      if ((!isLoopBackEdge) ||
         (BVar9 = BVSparse<Memory::JitArenaAllocator>::Test
                            ((this->curLoop->regAlloc).liveOnBackEdgeSyms,
                             ((*ppLVar12)->sym->super_Sym).m_id), BVar9 == '\0')) {
        SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear(&(*ppLVar12)->defList);
        SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear(&(*ppLVar12)->useList);
        RVar2 = (*ppLVar12)->reg;
        uVar14 = (ulong)RVar2;
        BVUnitT<unsigned_long>::AssertRange((uint)RVar2);
        uVar15 = -2L << (RVar2 & (RegXMM15|RegXMM14)) |
                 0xfffffffffffffffeU >> 0x40 - (RVar2 & (RegXMM15|RegXMM14));
        (this->activeRegs).word = (this->activeRegs).word & uVar15;
        this->regContent[uVar14] = (Lifetime *)0x0;
        BVUnitT<unsigned_long>::AssertRange((uint)RVar2);
        (this->secondChanceRegs).word = (this->secondChanceRegs).word & uVar15;
        if (uVar14 - 1 < 0x10) {
          this->intRegUsedCount = this->intRegUsedCount - 1;
        }
        else {
          if (0xf < uVar14 - 0x11) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                               ,0x958,"(RegTypes[reg] == TyFloat64)","RegTypes[reg] == TyFloat64");
            if (!bVar8) goto LAB_005857fa;
            *puVar11 = 0;
          }
          this->floatRegUsedCount = this->floatRegUsedCount - 1;
        }
        buffer_00 = iter.super_EditingIterator.super_Iterator.list;
        pAVar4 = *(ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> **)
                  ((long)local_80 + 0x10);
        SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::UnlinkCurrentNode
                  ((EditingIterator *)local_80);
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                  (pAVar4,buffer_00,0x10);
      }
    } while (uVar3 <= uVar10);
    buffer = this->stackPackInUseLiveRanges;
    iter.super_EditingIterator.last = (NodeBase *)buffer;
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      this_00 = &iter.super_EditingIterator.last;
      bVar8 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                        ((EditingIterator *)this_00);
      if (!bVar8) {
        return;
      }
      ppLVar12 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)this_00);
      uVar3 = (*ppLVar12)->end;
      uVar10 = IR::Instr::GetNumber(instr);
      if (uVar10 < uVar3) {
        return;
      }
      if ((!isLoopBackEdge) ||
         (BVar9 = BVSparse<Memory::JitArenaAllocator>::Test
                            ((this->curLoop->regAlloc).liveOnBackEdgeSyms,
                             ((*ppLVar12)->sym->super_Sym).m_id), BVar9 == '\0')) {
        SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear(&(*ppLVar12)->defList);
        SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear(&(*ppLVar12)->useList);
        if (((*ppLVar12)->field_0x9d & 0x10) == 0) {
          if ((*ppLVar12)->spillStackSlot == (StackSlot *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                               ,0x971,"(deadStackPack->spillStackSlot)",
                               "deadStackPack->spillStackSlot");
            if (!bVar8) {
LAB_005857fa:
              pcVar7 = (code *)invalidInstructionException();
              (*pcVar7)();
            }
            *puVar11 = 0;
          }
          pLVar5 = *ppLVar12;
          pLVar5->spillStackSlot->lastUse = pLVar5->end;
          pSVar6 = this->stackSlotsFreeList;
          pSVar13 = (Type)new<Memory::ArenaAllocator>(0x10,pSVar6->allocator,0x366bee);
          pSVar13[1].next = (Type)pLVar5->spillStackSlot;
          pSVar13->next =
               (pSVar6->super_SListBase<StackSlot_*,_Memory::ArenaAllocator,_RealCount>).
               super_SListNodeBase<Memory::ArenaAllocator>.next;
          (pSVar6->super_SListBase<StackSlot_*,_Memory::ArenaAllocator,_RealCount>).
          super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar13;
          pRVar1 = &(pSVar6->super_SListBase<StackSlot_*,_Memory::ArenaAllocator,_RealCount>).
                    super_RealCount;
          pRVar1->count = pRVar1->count + 1;
        }
        pAVar4 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                 iter.super_EditingIterator.last[2].next;
        SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::UnlinkCurrentNode
                  ((EditingIterator *)&iter.super_EditingIterator.last);
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                  (pAVar4,buffer,0x10);
      }
    } while (uVar3 <= uVar10);
  }
  return;
}

Assistant:

void
LinearScan::EndDeadLifetimes(IR::Instr *instr, bool isLoopBackEdge)
{
    if (this->SkipNumberedInstr(instr))
    {
        return;
    }

    // Retire all active lifetime ending at this instruction
    FOREACH_SLIST_ENTRY_EDITING(Lifetime *, deadLifetime, this->activeLiveranges, iter)
    {
        if (deadLifetime->end > instr->GetNumber())
        {
            break;
        }

        if (isLoopBackEdge && this->curLoop->regAlloc.liveOnBackEdgeSyms->Test(deadLifetime->sym->m_id))
        {
            continue;
        }
        deadLifetime->defList.Clear();
        deadLifetime->useList.Clear();

        RegNum reg = deadLifetime->reg;
        this->activeRegs.Clear(reg);
        this->regContent[reg] = nullptr;
        this->secondChanceRegs.Clear(reg);
        if (RegTypes[reg] == TyMachReg)
        {
            this->intRegUsedCount--;
        }
        else
        {
            Assert(RegTypes[reg] == TyFloat64);
            this->floatRegUsedCount--;
        }
        iter.RemoveCurrent();

    } NEXT_SLIST_ENTRY_EDITING;

    // Look for spilled lifetimes which end here such that we can make their stack slot
    // available for stack-packing.
    FOREACH_SLIST_ENTRY_EDITING(Lifetime *, deadStackPack, this->stackPackInUseLiveRanges, stackPackIter)
    {
        if (deadStackPack->end > instr->GetNumber())
        {
            break;
        }

        if (isLoopBackEdge && this->curLoop->regAlloc.liveOnBackEdgeSyms->Test(deadStackPack->sym->m_id))
        {
            continue;
        }
        deadStackPack->defList.Clear();
        deadStackPack->useList.Clear();

        if (!deadStackPack->cantStackPack)
        {
            Assert(deadStackPack->spillStackSlot);
            deadStackPack->spillStackSlot->lastUse = deadStackPack->end;
            this->stackSlotsFreeList->Push(deadStackPack->spillStackSlot);
        }
        stackPackIter.RemoveCurrent();
    } NEXT_SLIST_ENTRY_EDITING;

}